

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O0

void audit_regressor(audit_regressor_data *rd,single_learner *base,example *ec)

{
  uchar *puVar1;
  uchar **ppuVar2;
  v_array<float> *this;
  size_t sVar3;
  audit_strings *paVar4;
  __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  *this_00;
  v_array<unsigned_char> *in_RDX;
  long *in_RDI;
  size_t j_1;
  size_t j;
  features *fs;
  uchar *i;
  uint64_t old_offset;
  vw *all;
  example *in_stack_00000220;
  single_learner *in_stack_00000228;
  audit_regressor_data *in_stack_00000230;
  uint64_t in_stack_00000260;
  float in_stack_0000026c;
  sparse_parameters *in_stack_00000270;
  audit_regressor_data *in_stack_00000278;
  example_predict *in_stack_00000280;
  undefined1 in_stack_0000028f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000290;
  audit_strings *f;
  audit_regressor_data *dat;
  ulong local_48;
  audit_strings *local_40;
  audit_regressor_data *local_30;
  
  if (*(int *)(*in_RDI + 0x3478) == 0) {
    in_RDI[2] = 0;
    puVar1 = in_RDX[0x341]._begin;
    while ((ulong)in_RDI[2] < (ulong)in_RDI[3]) {
      ppuVar2 = v_array<unsigned_char>::begin(in_RDX);
      local_30 = (audit_regressor_data *)*ppuVar2;
      while (dat = local_30, ppuVar2 = v_array<unsigned_char>::end(in_RDX),
            dat != (audit_regressor_data *)*ppuVar2) {
        this = (v_array<float> *)((long)in_RDX + (ulong)*(byte *)&local_30->all * 0x68 + 0x20);
        sVar3 = v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::size((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(this + 2));
        if (sVar3 == 0) {
          for (local_48 = 0; sVar3 = features::size((features *)0x2fe1f3), local_48 < sVar3;
              local_48 = local_48 + 1) {
            v_array<float>::operator[](this,local_48);
            v_array<unsigned_long>::operator[]((v_array<unsigned_long> *)(this + 1),local_48);
            audit_regressor_feature
                      ((audit_regressor_data *)in_stack_00000270,in_stack_0000026c,in_stack_00000260
                      );
          }
        }
        else {
          local_40 = (audit_strings *)0x0;
          while (f = local_40, paVar4 = (audit_strings *)features::size((features *)0x2fe10b),
                f < paVar4) {
            this_00 = &v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)(this + 2),(size_t)local_40)->
                       super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ;
            std::
            __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ::get(this_00);
            audit_regressor_interaction(dat,f);
            v_array<float>::operator[](this,(size_t)local_40);
            v_array<unsigned_long>::operator[]
                      ((v_array<unsigned_long> *)(this + 1),(size_t)local_40);
            audit_regressor_feature
                      ((audit_regressor_data *)in_stack_00000270,in_stack_0000026c,in_stack_00000260
                      );
            audit_regressor_interaction(dat,f);
            local_40 = (audit_strings *)&(local_40->first).field_0x1;
          }
        }
        local_30 = (audit_regressor_data *)((long)&local_30->all + 1);
      }
      if ((*(byte *)(*in_RDI + 0x3590) & 1) == 0) {
        INTERACTIONS::
        generate_interactions<audit_regressor_data,_const_unsigned_long,_&audit_regressor_feature,_true,_&audit_regressor_interaction,_dense_parameters>
                  (in_stack_00000290,(bool)in_stack_0000028f,in_stack_00000280,in_stack_00000278,
                   (dense_parameters *)in_stack_00000270);
      }
      else {
        INTERACTIONS::
        generate_interactions<audit_regressor_data,_const_unsigned_long,_&audit_regressor_feature,_true,_&audit_regressor_interaction,_sparse_parameters>
                  (in_stack_00000290,(bool)in_stack_0000028f,in_stack_00000280,in_stack_00000278,
                   in_stack_00000270);
      }
      in_RDX[0x341]._begin = in_RDX[0x341]._begin + in_RDI[1];
      in_RDI[2] = in_RDI[2] + 1;
    }
    in_RDX[0x341]._begin = puVar1;
  }
  else {
    audit_regressor_lda(in_stack_00000230,in_stack_00000228,in_stack_00000220);
  }
  return;
}

Assistant:

void audit_regressor(audit_regressor_data& rd, LEARNER::single_learner& base, example& ec)
{
  vw& all = *rd.all;

  if (all.lda > 0)
    audit_regressor_lda(rd, base, ec);
  else
  {
    rd.cur_class = 0;
    uint64_t old_offset = ec.ft_offset;

    while (rd.cur_class < rd.total_class_cnt)
    {
      for (unsigned char* i = ec.indices.begin(); i != ec.indices.end(); ++i)
      {
        features& fs = ec.feature_space[(size_t)*i];
        if (fs.space_names.size() > 0)
          for (size_t j = 0; j < fs.size(); ++j)
          {
            audit_regressor_interaction(rd, fs.space_names[j].get());
            audit_regressor_feature(rd, fs.values[j], (uint32_t)fs.indicies[j] + ec.ft_offset);
            audit_regressor_interaction(rd, NULL);
          }
        else
          for (size_t j = 0; j < fs.size(); ++j)
            audit_regressor_feature(rd, fs.values[j], (uint32_t)fs.indicies[j] + ec.ft_offset);
      }

      if (rd.all->weights.sparse)
        INTERACTIONS::generate_interactions<audit_regressor_data, const uint64_t, audit_regressor_feature, true,
            audit_regressor_interaction, sparse_parameters>(
            rd.all->interactions, rd.all->permutations, ec, rd, rd.all->weights.sparse_weights);
      else
        INTERACTIONS::generate_interactions<audit_regressor_data, const uint64_t, audit_regressor_feature, true,
            audit_regressor_interaction, dense_parameters>(
            rd.all->interactions, rd.all->permutations, ec, rd, rd.all->weights.dense_weights);

      ec.ft_offset += rd.increment;
      ++rd.cur_class;
    }

    ec.ft_offset = old_offset;  // make sure example is not changed.
  }
}